

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::BufferStorage::Buffer::InitStorage
          (Buffer *this,GLenum target,GLenum flags,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  
  Release(this);
  this->m_target = target;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  Generate(gl,&this->m_id);
  Bind(gl,this->m_id,this->m_target);
  Storage(gl,this->m_target,flags,size,data);
  return;
}

Assistant:

void Buffer::InitStorage(glw::GLenum target, glw::GLenum flags, glw::GLsizeiptr size, const glw::GLvoid* data)
{
	/* Delete previous buffer instance */
	Release();

	m_target = target;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_target);
	Storage(gl, m_target, flags, size, data);
}